

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_make_type_predicate_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type)

{
  sexp psVar1;
  
  if ((((ulong)type & 3) == 0) && (type->tag == 1)) {
    type = (sexp)((ulong)(type->value).type.tag * 2 + 1);
  }
  if (((ulong)type & 1) == 0) {
    psVar1 = sexp_type_exception(ctx,self,2,type);
    return psVar1;
  }
  psVar1 = sexp_alloc_tagged_aux(ctx,0x70,0x1b);
  *(undefined4 *)((long)&psVar1->value + 0x58) = 0x12f02;
  (psVar1->value).type.id = (sexp)0x1;
  (psVar1->value).port.offset = 1;
  (psVar1->value).flonum_bits[0x5c] = '\0';
  (psVar1->value).type.cpl = type;
  (psVar1->value).type.slots = (sexp)0x0;
  (psVar1->value).opcode.func = (sexp_proc1)0x0;
  (psVar1->value).type.name = name;
  (psVar1->value).opcode.dl = (sexp)(ctx->value).opcode.func;
  return psVar1;
}

Assistant:

sexp sexp_make_type_predicate_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type) {
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, type);
  return sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_TYPE_PREDICATE),
                          sexp_make_fixnum(SEXP_OP_TYPEP), SEXP_ONE, SEXP_ZERO,
                          SEXP_ZERO, SEXP_ZERO, SEXP_ZERO, type, NULL, NULL);
}